

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O1

void Gia_ManSimDelete(Gia_ManSim_t *p)

{
  int *piVar1;
  
  if (p->vConsts != (Vec_Int_t *)0x0) {
    piVar1 = p->vConsts->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vConsts->pArray = (int *)0x0;
    }
    if (p->vConsts != (Vec_Int_t *)0x0) {
      free(p->vConsts);
      p->vConsts = (Vec_Int_t *)0x0;
    }
  }
  if (p->vCis2Ids != (Vec_Int_t *)0x0) {
    piVar1 = p->vCis2Ids->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vCis2Ids->pArray = (int *)0x0;
    }
    if (p->vCis2Ids != (Vec_Int_t *)0x0) {
      free(p->vCis2Ids);
      p->vCis2Ids = (Vec_Int_t *)0x0;
    }
  }
  Gia_ManStopP(&p->pAig);
  if (p->pDataSim != (uint *)0x0) {
    free(p->pDataSim);
    p->pDataSim = (uint *)0x0;
  }
  if (p->pDataSimCis != (uint *)0x0) {
    free(p->pDataSimCis);
    p->pDataSimCis = (uint *)0x0;
  }
  if (p->pDataSimCos != (uint *)0x0) {
    free(p->pDataSimCos);
    p->pDataSimCos = (uint *)0x0;
  }
  if (p != (Gia_ManSim_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Gia_ManSimDelete( Gia_ManSim_t * p )
{
    Vec_IntFreeP( &p->vConsts );
    Vec_IntFreeP( &p->vCis2Ids );
    Gia_ManStopP( &p->pAig );
    ABC_FREE( p->pDataSim );
    ABC_FREE( p->pDataSimCis );
    ABC_FREE( p->pDataSimCos );
    ABC_FREE( p );
}